

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

buffer_t ZSTDMT_getBuffer(ZSTDMT_bufferPool *bufPool)

{
  ulong uVar1;
  uint uVar2;
  void *ptr;
  size_t size;
  buffer_t bVar3;
  
  size = bufPool->bufferSize;
  pthread_mutex_lock((pthread_mutex_t *)bufPool);
  if (bufPool->nbBuffers != 0) {
    uVar2 = bufPool->nbBuffers - 1;
    bufPool->nbBuffers = uVar2;
    ptr = bufPool->bTable[uVar2].start;
    uVar1 = bufPool->bTable[uVar2].capacity;
    bufPool->bTable[uVar2].start = (void *)0x0;
    bufPool->bTable[uVar2].capacity = 0;
    if (size <= uVar1 && uVar1 >> 3 <= size) {
      pthread_mutex_unlock((pthread_mutex_t *)bufPool);
      size = uVar1;
      goto LAB_001a7782;
    }
    ZSTD_customFree(ptr,bufPool->cMem);
  }
  pthread_mutex_unlock((pthread_mutex_t *)bufPool);
  ptr = ZSTD_customMalloc(size,bufPool->cMem);
  if (ptr == (void *)0x0) {
    size = 0;
  }
LAB_001a7782:
  bVar3.capacity = size;
  bVar3.start = ptr;
  return bVar3;
}

Assistant:

static buffer_t ZSTDMT_getBuffer(ZSTDMT_bufferPool* bufPool)
{
    size_t const bSize = bufPool->bufferSize;
    DEBUGLOG(5, "ZSTDMT_getBuffer: bSize = %u", (U32)bufPool->bufferSize);
    ZSTD_pthread_mutex_lock(&bufPool->poolMutex);
    if (bufPool->nbBuffers) {   /* try to use an existing buffer */
        buffer_t const buf = bufPool->bTable[--(bufPool->nbBuffers)];
        size_t const availBufferSize = buf.capacity;
        bufPool->bTable[bufPool->nbBuffers] = g_nullBuffer;
        if ((availBufferSize >= bSize) & ((availBufferSize>>3) <= bSize)) {
            /* large enough, but not too much */
            DEBUGLOG(5, "ZSTDMT_getBuffer: provide buffer %u of size %u",
                        bufPool->nbBuffers, (U32)buf.capacity);
            ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
            return buf;
        }
        /* size conditions not respected : scratch this buffer, create new one */
        DEBUGLOG(5, "ZSTDMT_getBuffer: existing buffer does not meet size conditions => freeing");
        ZSTD_customFree(buf.start, bufPool->cMem);
    }
    ZSTD_pthread_mutex_unlock(&bufPool->poolMutex);
    /* create new buffer */
    DEBUGLOG(5, "ZSTDMT_getBuffer: create a new buffer");
    {   buffer_t buffer;
        void* const start = ZSTD_customMalloc(bSize, bufPool->cMem);
        buffer.start = start;   /* note : start can be NULL if malloc fails ! */
        buffer.capacity = (start==NULL) ? 0 : bSize;
        if (start==NULL) {
            DEBUGLOG(5, "ZSTDMT_getBuffer: buffer allocation failure !!");
        } else {
            DEBUGLOG(5, "ZSTDMT_getBuffer: created buffer of size %u", (U32)bSize);
        }
        return buffer;
    }
}